

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O0

int __thiscall
pg::PSISolver::switch_strategy
          (PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int pl,int begin,int count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Error *this_00;
  int local_88;
  int local_80;
  int local_7c;
  int local_74;
  int res_1;
  int to;
  int *curedge;
  int cur_strat;
  int local_3c;
  int n;
  int i;
  int res;
  int count_local;
  int begin_local;
  int pl_local;
  Task *__lace_dq_head_local;
  WorkerP *__lace_worker_local;
  PSISolver *this_local;
  
  if (count < 0x40) {
    n = 0;
    for (local_3c = 0; local_3c < count; local_3c = local_3c + 1) {
      iVar2 = begin + local_3c;
      if (*(int *)(done + (long)iVar2 * 4) != 3) {
        if (*(int *)(done + (long)iVar2 * 4) == 0) {
          this_00 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(this_00,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/psi.cpp"
                       ,0x145);
          __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
        }
        iVar3 = Solver::owner(&this->super_Solver,iVar2);
        if (iVar3 == pl) {
          curedge._0_4_ = *(int *)(str + (long)iVar2 * 4);
          for (_res_1 = Solver::outs(&this->super_Solver,iVar2); *_res_1 != -1; _res_1 = _res_1 + 1)
          {
            iVar3 = *_res_1;
            bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)iVar3);
            if ((!bVar1) && (iVar3 != (int)curedge)) {
              if (pl == 0) {
                if (*(int *)(halt + (long)(int)curedge * 4) == 0) {
                  local_74 = (int)curedge;
                }
                else {
                  local_74 = -1;
                }
                local_7c = iVar3;
                if (*(int *)(halt + (long)iVar3 * 4) != 0) {
                  local_7c = -1;
                }
                bVar1 = si_val_less(this,local_74,local_7c);
                if (bVar1) {
                  *(int *)(str + (long)iVar2 * 4) = iVar3;
                  n = n + 1;
                  curedge._0_4_ = iVar3;
                }
              }
              else {
                local_80 = iVar3;
                if (*(int *)(halt + (long)iVar3 * 4) != 0) {
                  local_80 = -1;
                }
                if (*(int *)(halt + (long)(int)curedge * 4) == 0) {
                  local_88 = (int)curedge;
                }
                else {
                  local_88 = -1;
                }
                bVar1 = si_val_less(this,local_80,local_88);
                if (bVar1) {
                  *(int *)(str + (long)iVar2 * 4) = iVar3;
                  n = n + 1;
                  curedge._0_4_ = iVar3;
                }
              }
            }
          }
        }
      }
    }
    this_local._4_4_ = n;
  }
  else {
    switch_strategy_SPAWN(__lace_worker,__lace_dq_head,this,pl,begin + count / 2,count - count / 2);
    iVar2 = switch_strategy_CALL(__lace_worker,__lace_dq_head + 1,this,pl,begin,count / 2);
    iVar3 = switch_strategy_SYNC(__lace_worker,__lace_dq_head);
    this_local._4_4_ = iVar3 + iVar2;
  }
  return this_local._4_4_;
}

Assistant:

int
PSISolver::switch_strategy(WorkerP* __lace_worker, Task* __lace_dq_head, int pl, int begin, int count)
{
    // some cut-off point...
    if (count < 64) {
        int res = 0;
        for (int i=0; i<count; i++) {
            int n = begin+i;

            if (done[n] == 3) continue; // skip "disabled or won"
            if (done[n] == 0) LOGIC_ERROR; // expecting done==1 or done==2
            if (owner(n) != pl) continue; // only change strategy if owner

            int cur_strat = str[n];
            for (auto curedge = outs(n); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue; // skip strategy to disabled
                if (to == cur_strat) continue; // skip strategy to same
                if (pl == 0) {
                    // improving for player Even
                    if (si_val_less(halt[cur_strat] ? -1 : cur_strat, halt[to] ? -1 : to)) {
                        str[n] = cur_strat = to;
                        res++;
                    }
                } else {
                    // improving for player Odd
                    if (si_val_less(halt[to] ? -1 : to, halt[cur_strat] ? -1 : cur_strat)) {
                        str[n] = cur_strat = to;
                        res++;
                    }
                }
            }
        }
        return res;
    } else {
        SPAWN(switch_strategy, this, pl, begin+count/2, count-count/2);
        int res = CALL(switch_strategy, this, pl, begin, count/2);
        res += SYNC(switch_strategy);
        return res;
    }
}